

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool IsPhiUsed(VmInstruction *phi,uint searchMarker)

{
  bool bVar1;
  VmInstruction *phi_00;
  ulong uVar2;
  
  if (phi->cmd != VM_INST_PHI) {
    __assert_fail("phi->cmd == VM_INST_PHI",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1782,"bool IsPhiUsed(VmInstruction *, unsigned int)");
  }
  if ((phi->regVmSearchMarker != searchMarker) &&
     (phi->regVmSearchMarker = searchMarker, (phi->super_VmValue).users.count != 0)) {
    uVar2 = 0;
    do {
      phi_00 = (VmInstruction *)(phi->super_VmValue).users.data[uVar2];
      if ((phi_00 == (VmInstruction *)0x0) || ((phi_00->super_VmValue).typeID != 2)) {
        phi_00 = (VmInstruction *)0x0;
      }
      if (phi_00->cmd != VM_INST_PHI) {
        return true;
      }
      bVar1 = IsPhiUsed(phi_00,searchMarker);
      if (bVar1) {
        return true;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (phi->super_VmValue).users.count);
  }
  return false;
}

Assistant:

bool IsPhiUsed(VmInstruction *phi, unsigned searchMarker)
{
	assert(phi->cmd == VM_INST_PHI);

	if(phi->regVmSearchMarker == searchMarker)
		return false;

	phi->regVmSearchMarker = searchMarker;

	for(unsigned userPos = 0; userPos < phi->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(phi->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
		{
			if(IsPhiUsed(instruction, searchMarker))
				return true;
		}
		else
		{
			return true;
		}
	}

	return false;
}